

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

_Bool sparc_cpu_tlb_fill_sparc
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  uint uVar1;
  MemTxAttrs local_60;
  int local_5c;
  MemTxAttrs attrs;
  int access_index;
  int prot;
  int error_code;
  target_ulong_conflict page_size;
  target_ulong_conflict vaddr;
  hwaddr paddr;
  CPUSPARCState *env;
  SPARCCPU_conflict *cpu;
  MMUAccessType MStack_28;
  _Bool probe_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  int size_local;
  vaddr address_local;
  CPUState *cs_local;
  
  paddr = (hwaddr)(cs[1].tb_jmp_cache + 0xe7);
  local_60 = (MemTxAttrs)0x0;
  env = (CPUSPARCState *)cs;
  cpu._3_1_ = probe;
  cpu._4_4_ = mmu_idx;
  MStack_28 = access_type;
  mmu_idx_local = size;
  address_local = (vaddr)cs;
  if (probe) {
    _access_type_local = address;
    __assert_fail("!probe",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/mmu_helper.c"
                  ,0xdc,
                  "_Bool sparc_cpu_tlb_fill_sparc(CPUState *, vaddr, int, MMUAccessType, int, _Bool, uintptr_t)"
                 );
  }
  _access_type_local = address & 0xfffff000;
  uVar1 = get_physical_address
                    ((CPUSPARCState *)paddr,(hwaddr *)&page_size,(int *)&attrs,&local_5c,&local_60,
                     (target_ulong_conflict)_access_type_local,access_type,mmu_idx,
                     (target_ulong_conflict *)&prot);
  error_code = (int)_access_type_local;
  if (uVar1 == 0) {
    tlb_set_page_sparc((CPUState *)address_local,error_code,_page_size,(int)attrs,cpu._4_4_,prot);
  }
  else {
    if (*(int *)(paddr + 0x92c) != 0) {
      *(undefined4 *)(paddr + 0x92c) = 1;
    }
    *(uint *)(paddr + 0x92c) = local_5c << 5 | uVar1 | 2 | *(uint *)(paddr + 0x92c);
    *(int *)(paddr + 0x930) = error_code;
    if (((*(uint *)(paddr + 0x920) & 2) == 0) && (*(int *)(paddr + 0xe4) != 0)) {
      if (MStack_28 == MMU_INST_FETCH) {
        *(undefined4 *)(address_local + 0x81a0) = 1;
      }
      else {
        *(undefined4 *)(address_local + 0x81a0) = 9;
      }
      cpu_loop_exit_restore_sparc((CPUState *)address_local,retaddr);
    }
    attrs = (MemTxAttrs)0x7;
    tlb_set_page_sparc((CPUState *)address_local,error_code,_page_size,7,cpu._4_4_,0x1000);
  }
  return true;
}

Assistant:

bool sparc_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                        MMUAccessType access_type, int mmu_idx,
                        bool probe, uintptr_t retaddr)
{
    SPARCCPU *cpu = SPARC_CPU(cs);
    CPUSPARCState *env = &cpu->env;
    hwaddr paddr;
    target_ulong vaddr;
    target_ulong page_size;
    int error_code = 0, prot, access_index;
    MemTxAttrs attrs = { 0 };

    /*
     * TODO: If we ever need tlb_vaddr_to_host for this target,
     * then we must figure out how to manipulate FSR and FAR
     * when both MMU_NF and probe are set.  In the meantime,
     * do not support this use case.
     */
    assert(!probe);

    address &= TARGET_PAGE_MASK;
    error_code = get_physical_address(env, &paddr, &prot, &access_index, &attrs,
                                      address, access_type,
                                      mmu_idx, &page_size);
    vaddr = address;
    if (likely(error_code == 0)) {
        qemu_log_mask(CPU_LOG_MMU,
                      "Translate at %" VADDR_PRIx " -> "
                      TARGET_FMT_plx ", vaddr " TARGET_FMT_lx "\n",
                      address, paddr, vaddr);
        tlb_set_page(cs, vaddr, paddr, prot, mmu_idx, page_size);
        return true;
    }

    if (env->mmuregs[3]) { /* Fault status register */
        env->mmuregs[3] = 1; /* overflow (not read before another fault) */
    }
    env->mmuregs[3] |= (access_index << 5) | error_code | 2;
    env->mmuregs[4] = address; /* Fault address register */

    if ((env->mmuregs[0] & MMU_NF) || env->psret == 0)  {
        /* No fault mode: if a mapping is available, just override
           permissions. If no mapping is available, redirect accesses to
           neverland. Fake/overridden mappings will be flushed when
           switching to normal mode. */
        prot = PAGE_READ | PAGE_WRITE | PAGE_EXEC;
        tlb_set_page(cs, vaddr, paddr, prot, mmu_idx, TARGET_PAGE_SIZE);
        return true;
    } else {
        if (access_type == MMU_INST_FETCH) {
            cs->exception_index = TT_TFAULT;
        } else {
            cs->exception_index = TT_DFAULT;
        }
        cpu_loop_exit_restore(cs, retaddr);
    }
}